

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

void __thiscall TcpSocketImpl::ConnectThread(TcpSocketImpl *this)

{
  atomic_uchar *paVar1;
  BaseSocket *pBVar2;
  int iVar3;
  int iVar4;
  TcpSocketImpl *pTVar5;
  ulong uVar6;
  bool bVar7;
  socklen_t iLen;
  thread local_158;
  TcpSocketImpl *local_150;
  undefined8 local_148;
  TcpSocketImpl *local_140;
  timeval local_138;
  fd_set local_128;
  fd_set local_a8;
  
  LOCK();
  paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
  (paVar1->super___atomic_base<unsigned_char>)._M_i =
       (paVar1->super___atomic_base<unsigned_char>)._M_i & 0xfb;
  UNLOCK();
  if ((this->super_BaseSocketImpl).m_bStop == false) {
    do {
      local_138.tv_sec = 2;
      local_138.tv_usec = 0;
      local_a8.fds_bits[0xe] = 0;
      local_a8.fds_bits[0xf] = 0;
      local_a8.fds_bits[0xc] = 0;
      local_a8.fds_bits[0xd] = 0;
      local_a8.fds_bits[10] = 0;
      local_a8.fds_bits[0xb] = 0;
      local_a8.fds_bits[8] = 0;
      local_a8.fds_bits[9] = 0;
      local_a8.fds_bits[6] = 0;
      local_a8.fds_bits[7] = 0;
      local_a8.fds_bits[4] = 0;
      local_a8.fds_bits[5] = 0;
      local_a8.fds_bits[2] = 0;
      local_a8.fds_bits[3] = 0;
      local_a8.fds_bits[0] = 0;
      local_a8.fds_bits[1] = 0;
      local_128.fds_bits[0] = 0;
      local_128.fds_bits[1] = 0;
      local_128.fds_bits[2] = 0;
      local_128.fds_bits[3] = 0;
      local_128.fds_bits[4] = 0;
      local_128.fds_bits[5] = 0;
      local_128.fds_bits[6] = 0;
      local_128.fds_bits[7] = 0;
      local_128.fds_bits[8] = 0;
      local_128.fds_bits[9] = 0;
      local_128.fds_bits[10] = 0;
      local_128.fds_bits[0xb] = 0;
      local_128.fds_bits[0xc] = 0;
      local_128.fds_bits[0xd] = 0;
      local_128.fds_bits[0xe] = 0;
      local_128.fds_bits[0xf] = 0;
      iVar4 = (this->super_BaseSocketImpl).m_fSock;
      iVar3 = iVar4 + 0x3f;
      if (-1 < iVar4) {
        iVar3 = iVar4;
      }
      uVar6 = 1L << ((byte)iVar4 & 0x3f);
      local_a8.fds_bits[iVar3 >> 6] = local_a8.fds_bits[iVar3 >> 6] | uVar6;
      local_128.fds_bits[iVar3 >> 6] = local_128.fds_bits[iVar3 >> 6] | uVar6;
      iVar4 = select(iVar4 + 1,(fd_set *)0x0,&local_a8,&local_128,&local_138);
      bVar7 = (this->super_BaseSocketImpl).m_bStop;
      if (bVar7 == false && 0 < iVar4) {
        iVar4 = (this->super_BaseSocketImpl).m_fSock;
        iVar3 = iVar4 + 0x3f;
        if (-1 < iVar4) {
          iVar3 = iVar4;
        }
        if (((ulong)local_128.fds_bits[iVar3 >> 6] >> ((ulong)(uint)(iVar4 % 0x40) & 0x3f) & 1) != 0
           ) {
          local_140 = (TcpSocketImpl *)CONCAT44(local_140._4_4_,4);
          getsockopt(iVar4,1,4,&(this->super_BaseSocketImpl).m_iError,(socklen_t *)&local_140);
          (this->super_BaseSocketImpl).m_iErrLoc = 9;
          LOCK();
          (this->super_BaseSocketImpl).m_iShutDownState.super___atomic_base<unsigned_char>._M_i =
               '\x0f';
          UNLOCK();
          bVar7 = (this->super_BaseSocketImpl).m_bStop;
          if (bVar7 == false &&
              (this->super_BaseSocketImpl).m_fErrorParam.super__Function_base._M_manager !=
              (_Manager_type)0x0) {
            local_158._M_id._M_thread = (id)(this->super_BaseSocketImpl).m_pvUserData;
            local_150 = (TcpSocketImpl *)(this->super_BaseSocketImpl).m_pBkRef;
            (*(this->super_BaseSocketImpl).m_fErrorParam._M_invoker)
                      ((_Any_data *)&(this->super_BaseSocketImpl).m_fErrorParam,
                       (BaseSocket **)&local_150,(void **)&local_158);
          }
          else if ((this->super_BaseSocketImpl).m_fError.super__Function_base._M_manager !=
                   (_Manager_type)0x0 && bVar7 == false) {
            local_150 = (TcpSocketImpl *)(this->super_BaseSocketImpl).m_pBkRef;
            (*(this->super_BaseSocketImpl).m_fError._M_invoker)
                      ((_Any_data *)&(this->super_BaseSocketImpl).m_fError,(BaseSocket **)&local_150
                      );
          }
          break;
        }
        if ((local_a8.fds_bits[iVar3 >> 6] & 1L << ((byte)(iVar4 % 0x40) & 0x3f)) != 0) {
          GetConnectionInfo(this);
          local_150 = (TcpSocketImpl *)SelectThread;
          local_148 = 0;
          local_140 = this;
          std::thread::thread<void(TcpSocketImpl::*)(),TcpSocketImpl*,void>
                    (&local_158,(offset_in_TcpSocketImpl_to_subr *)&local_150,&local_140);
          if ((this->super_BaseSocketImpl).m_thListen._M_id._M_thread == 0) {
            (this->super_BaseSocketImpl).m_thListen._M_id._M_thread =
                 (native_handle_type)local_158._M_id._M_thread;
            local_150 = (TcpSocketImpl *)WriteThread;
            local_148 = 0;
            local_140 = this;
            std::thread::thread<void(TcpSocketImpl::*)(),TcpSocketImpl*,void>
                      (&local_158,(offset_in_TcpSocketImpl_to_subr *)&local_150,&local_140);
            if ((this->super_BaseSocketImpl).m_thWrite._M_id._M_thread == 0) {
              (this->super_BaseSocketImpl).m_thWrite._M_id._M_thread =
                   (native_handle_type)local_158._M_id._M_thread;
              pBVar2 = (this->super_BaseSocketImpl).m_pBkRef;
              if (pBVar2 != (BaseSocket *)0x0) {
                pTVar5 = (TcpSocketImpl *)
                         __dynamic_cast(pBVar2,&BaseSocket::typeinfo,&TcpSocket::typeinfo,0);
                if (pTVar5 == (TcpSocketImpl *)0x0 ||
                    (this->m_fClientConnectedParam).super__Function_base._M_manager ==
                    (_Manager_type)0x0) {
                  if ((this->m_fClientConnected).super__Function_base._M_manager !=
                      (_Manager_type)0x0 && pTVar5 != (TcpSocketImpl *)0x0) {
                    local_150 = pTVar5;
                    (*(this->m_fClientConnected)._M_invoker)
                              ((_Any_data *)&this->m_fClientConnected,(TcpSocket **)&local_150);
                  }
                }
                else {
                  local_158._M_id._M_thread = (id)(this->super_BaseSocketImpl).m_pvUserData;
                  local_150 = pTVar5;
                  (*(this->m_fClientConnectedParam)._M_invoker)
                            ((_Any_data *)&this->m_fClientConnectedParam,(TcpSocket **)&local_150,
                             (void **)&local_158);
                }
              }
              if ((this->m_fClientConnectedSsl).super__Function_base._M_manager !=
                  (_Manager_type)0x0) {
                local_150 = (TcpSocketImpl *)0x0;
                (*(this->m_fClientConnectedSsl)._M_invoker)
                          ((_Any_data *)&this->m_fClientConnectedSsl,&local_150);
              }
              break;
            }
          }
          std::terminate();
        }
      }
    } while (bVar7 == false);
  }
  LOCK();
  paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
  (paVar1->super___atomic_base<unsigned_char>)._M_i =
       (paVar1->super___atomic_base<unsigned_char>)._M_i | 4;
  UNLOCK();
  paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
  LOCK();
  bVar7 = (paVar1->super___atomic_base<unsigned_char>)._M_i == '\a';
  if (bVar7) {
    (paVar1->super___atomic_base<unsigned_char>)._M_i = '\x0f';
  }
  UNLOCK();
  if (bVar7) {
    iVar4 = (this->super_BaseSocketImpl).m_fSock;
    if (iVar4 != -1) {
      close(iVar4);
      (this->super_BaseSocketImpl).m_fSock = -1;
    }
    (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])(this);
    if (this->m_bSelfDelete == true) {
      (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x16])(this);
    }
  }
  return;
}

Assistant:

void TcpSocketImpl::ConnectThread()
{
    m_iShutDownState &= static_cast<uint8_t>(~4);

    while (m_bStop == false)
    {
        fd_set writefd{}, errorfd{};
        struct timeval timeout{};

        timeout.tv_sec = 2;
        timeout.tv_usec = 0;
        FD_ZERO(&writefd);
        FD_ZERO(&errorfd);

        FD_SET(m_fSock, &writefd);
        FD_SET(m_fSock, &errorfd);

        if (::select(static_cast<int>(m_fSock + 1), nullptr, &writefd, &errorfd, &timeout) > 0 && m_bStop == false)
        {
            if (FD_ISSET(m_fSock, &errorfd))
            {
                socklen_t iLen = sizeof(m_iError);
                getsockopt(m_fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&m_iError), &iLen);
                m_iErrLoc = 9;
                m_iShutDownState = 15;
                if (m_fErrorParam && m_bStop == false)
                    m_fErrorParam(m_pBkRef, m_pvUserData);
                else if (m_fError && m_bStop == false)
                    m_fError(m_pBkRef);
                break;
            }

            if (FD_ISSET(m_fSock, &writefd))
            {
                GetConnectionInfo();

                m_thListen = thread(&TcpSocketImpl::SelectThread, this);
                m_thWrite = thread(&TcpSocketImpl::WriteThread, this);

                TcpSocket* pTcpSocket = dynamic_cast<TcpSocket*>(m_pBkRef);
                if (m_fClientConnectedParam && pTcpSocket != nullptr)
                    m_fClientConnectedParam(pTcpSocket, m_pvUserData);
                else if (m_fClientConnected && pTcpSocket != nullptr)
                    m_fClientConnected(pTcpSocket);

                if (m_fClientConnectedSsl)
                    m_fClientConnectedSsl(nullptr);
                break;
            }
        }
    }

    m_iShutDownState |= 4;

    unsigned char cExpected = 7;
    if (m_iShutDownState.compare_exchange_strong(cExpected, 15) == true)
    {
        if (m_fSock != INVALID_SOCKET)
        {
            ::closesocket(m_fSock);
            m_fSock = INVALID_SOCKET;
        }

        StartClosingCB();

        if (m_bSelfDelete == true)    // Auto-delete, socket created from server socket
            Delete();// thread([&]() { delete this; }).detach();
    }
}